

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,char *name)

{
  BenchmarkImp *this_00;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_00129830;
  this_00 = (BenchmarkImp *)operator_new(0x68);
  BenchmarkImp::BenchmarkImp(this_00,name);
  this->imp_ = this_00;
  return;
}

Assistant:

Benchmark::Benchmark(const char* name)
    : imp_(new BenchmarkImp(name))
{
}